

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

int __thiscall
nonstd::any_lite::any::holder<(anonymous_namespace)::InitList>::clone
          (holder<(anonymous_namespace)::InitList> *this,__fn *__fn,void *__child_stack,int __flags,
          void *__arg,...)

{
  holder<(anonymous_namespace)::InitList> *this_00;
  holder<(anonymous_namespace)::InitList> *this_local;
  
  this_00 = (holder<(anonymous_namespace)::InitList> *)operator_new(0x30);
  holder(this_00,&this->held);
  return (int)this_00;
}

Assistant:

virtual placeholder * clone() const any_override
        {
            return new holder( held );
        }